

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Production.cpp
# Opt level: O1

bool __thiscall
SGParser::Generator::ParseTableProduction::operator==
          (ParseTableProduction *this,ParseTableProduction *right)

{
  bool bVar1;
  
  if (this->pProduction->Left == right->pProduction->Left) {
    bVar1 = Production::RHSEquals(this->pProduction,right->pProduction);
    if (((bVar1) && (this->Dot == right->Dot)) &&
       ((this->LookAhead)._M_t._M_impl.super__Rb_tree_header._M_node_count ==
        (right->LookAhead)._M_t._M_impl.super__Rb_tree_header._M_node_count)) {
      bVar1 = std::__equal<false>::
              equal<std::_Rb_tree_const_iterator<unsigned_int>,std::_Rb_tree_const_iterator<unsigned_int>>
                        ((this->LookAhead)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                         (_Rb_tree_const_iterator<unsigned_int>)
                         &(this->LookAhead)._M_t._M_impl.super__Rb_tree_header,
                         (right->LookAhead)._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool ParseTableProduction::operator==(const ParseTableProduction& right) const noexcept {
    return (*pProduction == *right.pProduction) && (Dot == right.Dot) &&
           (LookAhead == right.LookAhead);
}